

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * str_cpynextword(char *dst,char *src,size_t len)

{
  ulong uVar1;
  ushort **ppuVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (src == (char *)0x0) {
    *dst = '\0';
    pcVar6 = (char *)0x0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    pcVar6 = src + -1;
    do {
      pcVar5 = pcVar6;
      pcVar6 = pcVar5 + 1;
    } while (((*ppuVar2)[pcVar5[1]] & 1) != 0);
    cVar4 = *pcVar6;
    if (cVar4 == '\0') {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        if ((((*ppuVar2)[cVar4] & 1) != 0) || (len - 1 <= uVar3)) {
          pcVar6 = pcVar6 + uVar3;
          goto LAB_00129ff4;
        }
        uVar1 = uVar3 + 1;
        dst[uVar3] = cVar4;
        cVar4 = pcVar5[uVar3 + 2];
        uVar3 = uVar1;
      } while (cVar4 != '\0');
      pcVar6 = pcVar6 + uVar1;
    }
LAB_00129ff4:
    dst[uVar3] = '\0';
    pcVar6 = pcVar6 + -1;
    do {
      pcVar5 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (((*ppuVar2)[*pcVar5] & 1) != 0);
    if (*pcVar5 == '\0') {
      pcVar6 = (char *)0x0;
    }
  }
  return pcVar6;
}

Assistant:

const char *
str_cpynextword(char *dst, const char *src, size_t len) {
  size_t i;

  /* sanity check */
  if (src == NULL) {
    *dst = 0;
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  i = 0;
  while (*src != 0 && !isblank(*src) && i < len - 1) {
    dst[i++] = *src++;
  }

  /* terminate */
  dst[i] = 0;

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}